

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

Buffer * ReadFile(Buffer *__return_storage_ptr__,char *filename)

{
  size_type __n;
  byte bVar1;
  _Ios_Openmode _Var2;
  uchar *puVar3;
  runtime_error *prVar4;
  allocator<unsigned_char> local_2b2;
  undefined1 local_2b1;
  fpos local_2b0 [16];
  size_type local_2a0;
  streamsize size;
  string local_290 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [48];
  long local_220;
  ifstream file;
  char *filename_local;
  Buffer *data;
  
  _Var2 = std::operator|(_S_bin,_S_in);
  _Var2 = std::operator|(_Var2,_S_ate);
  std::ifstream::ifstream(&local_220,filename,_Var2);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) != 0) {
    size._6_1_ = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_290,"Failed to open file \"",(allocator *)((long)&size + 7));
    std::operator+(local_270,(char *)local_290);
    std::operator+(local_250,(char *)local_270);
    std::runtime_error::runtime_error(prVar4,(string *)local_250);
    size._6_1_ = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_2b0 = (fpos  [16])std::istream::tellg();
  local_2a0 = std::fpos::operator_cast_to_long(local_2b0);
  std::istream::seekg((long)&local_220,_S_beg);
  __n = local_2a0;
  local_2b1 = 0;
  std::allocator<unsigned_char>::allocator(&local_2b2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,__n,&local_2b2);
  std::allocator<unsigned_char>::~allocator(&local_2b2);
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(__return_storage_ptr__);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(__return_storage_ptr__);
  std::istream::read((char *)&local_220,(long)puVar3);
  bVar1 = std::ios::bad();
  if ((bVar1 & 1) != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Failed to read file.");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_2b1 = 1;
  std::ifstream::~ifstream(&local_220);
  return __return_storage_ptr__;
}

Assistant:

Buffer ReadFile(const char* filename) {
  std::ifstream file(filename, std::ios::binary | std::ios::in | std::ios::ate);
  if (!file) {
    throw Error(std::string("Failed to open file \"") + filename + "\".");
  }

  std::streamsize size = file.tellg();
  file.seekg(0, std::ios::beg);

  Buffer data(size);
  file.read(reinterpret_cast<char*>(data.data()), data.size());

  if (file.bad()) {
    throw Error("Failed to read file.");
  }

  return data;
}